

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O2

void get_colamd(int m,int n,int_t nnz,int_t *colptr,int_t *rowind,int *perm_c)

{
  int iVar1;
  size_t sVar2;
  int_t *A;
  int_t *p;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char msg [256];
  int_t stats [20];
  double knobs [20];
  
  sVar2 = colamd_recommended(nnz,m,n);
  colamd_set_defaults(knobs);
  A = intMalloc((int_t)sVar2);
  if (A == (int_t *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","Malloc fails for A[]",0x37,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg);
  }
  p = intMalloc(n + 1);
  if (p == (int_t *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","Malloc fails for p[]",0x38,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg);
  }
  for (lVar5 = 0; lVar5 <= n; lVar5 = lVar5 + 1) {
    p[lVar5] = colptr[lVar5];
  }
  uVar3 = 0;
  uVar4 = (ulong)(uint)nnz;
  if (nnz < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    A[uVar3] = rowind[uVar3];
  }
  iVar1 = colamd(m,n,(int_t)sVar2,A,p,knobs,stats);
  if (iVar1 == 0) {
    sprintf(msg,"%s at line %d in file %s\n","COLAMD failed",0x3f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg);
  }
  uVar4 = 0;
  if (n < 1) {
    n = 0;
  }
  for (; (uint)n != uVar4; uVar4 = uVar4 + 1) {
    perm_c[p[uVar4]] = (int)uVar4;
  }
  superlu_free(A);
  superlu_free(p);
  return;
}

Assistant:

void get_colamd(const int m, const int n, const int_t nnz,
                const int_t *colptr, const int_t *rowind, int *perm_c)
{
    size_t Alen;
    int_t *A, i, *p;
    int info;
    double knobs[COLAMD_KNOBS];
    int_t stats[COLAMD_STATS];

    Alen = COLAMD_recommended(nnz, m, n);

    COLAMD_set_defaults(knobs);

    if ( !(A = intMalloc(Alen)) ) ABORT("Malloc fails for A[]");
    if ( !(p = intMalloc(n+1)) )  ABORT("Malloc fails for p[]");
    for (i = 0; i <= n; ++i) p[i] = colptr[i];
    for (i = 0; i < nnz; ++i) A[i] = rowind[i];
    
    info = COLAMD_MAIN(m, n, Alen, A, p, knobs, stats);

    //printf("after COLAMD_MAIN info %d\n", info);
    if ( info == FALSE ) ABORT("COLAMD failed");

    for (i = 0; i < n; ++i) perm_c[p[i]] = i;

    SUPERLU_FREE(A);
    SUPERLU_FREE(p);
}